

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCount.h
# Opt level: O2

int If_LogCreateAndXor(Vec_Int_t *vAig,int iLit0,int iLit1,int nSuppAll,int fXor)

{
  int iVar1;
  
  if (fXor != 0) {
    iVar1 = Abc_LitNot(iLit1);
    iVar1 = If_LogCreateMux(vAig,iLit0,iVar1,iLit1,nSuppAll);
    return iVar1;
  }
  iVar1 = If_LogCreateAnd(vAig,iLit0,iLit1,nSuppAll);
  return iVar1;
}

Assistant:

static inline int If_LogCreateAndXor( Vec_Int_t * vAig, int iLit0, int iLit1, int nSuppAll, int fXor )
{
    return fXor ? If_LogCreateXor(vAig, iLit0, iLit1, nSuppAll) : If_LogCreateAnd(vAig, iLit0, iLit1, nSuppAll);
}